

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

bool efsw::Platform::isLocalFUSEDirectory(string *directory)

{
  bool bVar1;
  string devicePath;
  string local_50;
  string local_30;
  
  efsw::FileSystem::dirRemoveSlashAtEnd(directory);
  std::__cxx11::string::string((string *)&local_50,(string *)directory);
  findMountPoint(&local_30,&local_50);
  std::__cxx11::string::operator=((string *)directory,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (directory->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    findDevicePath(&local_30,directory);
    bVar1 = local_30._M_string_length != 0;
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool isLocalFUSEDirectory( std::string directory ) {
	efsw::FileSystem::dirRemoveSlashAtEnd( directory );

	directory = findMountPoint( directory );

	if ( !directory.empty() ) {
		std::string devicePath = findDevicePath( directory );

		return !devicePath.empty();
	}

	return false;
}